

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::double_writer::operator()(double_writer *this,wchar_t **it)

{
  int *piVar1;
  long lVar2;
  char *begin;
  type pwVar3;
  long *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  if ((char)in_RDI[1] != '\0') {
    lVar2 = in_RDI[1];
    piVar1 = (int *)*in_RSI;
    *in_RSI = (long)(piVar1 + 1);
    *piVar1 = (int)(char)lVar2;
    *in_RDI = *in_RDI + -1;
  }
  begin = internal::basic_buffer<char>::begin((basic_buffer<char> *)in_RDI[2]);
  internal::basic_buffer<char>::end((basic_buffer<char> *)in_RDI[2]);
  pwVar3 = internal::copy_str<wchar_t,char*,wchar_t*>
                     (begin,in_stack_ffffffffffffffd8,(wchar_t *)0x24b72e);
  *in_RSI = (long)pwVar3;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }